

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Hpipe::Context::write_to_stream(Context *this,ostream *os)

{
  bool bVar1;
  Vec<const_Hpipe::CharItem_*> *in_RDX;
  PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_> local_30;
  ostream *local_18;
  ostream *os_local;
  Context *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  pointed_values<Hpipe::Vec<Hpipe::CharItem_const*>>(&local_30,(Hpipe *)this,in_RDX);
  Hpipe::operator<<(os,&local_30);
  PointedValues<Hpipe::Vec<const_Hpipe::CharItem_*>_>::~PointedValues(&local_30);
  bVar1 = beg(this);
  if (bVar1) {
    std::operator<<(local_18," BEG");
  }
  bVar1 = eof(this);
  if (bVar1) {
    std::operator<<(local_18," EOF");
  }
  bVar1 = not_eof(this);
  if (bVar1) {
    std::operator<<(local_18," NOT_EOF");
  }
  return;
}

Assistant:

void Context::write_to_stream( std::ostream &os ) const {
    os << pointed_values( pos );
    if ( beg() )
        os << " BEG";
    if ( eof() )
        os << " EOF";
    if ( not_eof() )
        os << " NOT_EOF";
}